

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.h
# Opt level: O0

void __thiscall ObjTypeSpecFldInfo::SetFieldValue(ObjTypeSpecFldInfo *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FixedFieldIDL **ppFVar4;
  Var value_local;
  ObjTypeSpecFldInfo *this_local;
  
  bVar2 = IsMono(this);
  if ((!bVar2) && ((bVar2 = IsPoly(this), !bVar2 || (bVar2 = DoesntHaveEquivalence(this), bVar2))))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.h"
                       ,0xa8,"(IsMono() || (IsPoly() && !DoesntHaveEquivalence()))",
                       "IsMono() || (IsPoly() && !DoesntHaveEquivalence())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppFVar4 = Memory::WriteBarrierPtr::operator_cast_to_FixedFieldIDL__
                      ((WriteBarrierPtr *)&(this->m_data).fixedFieldInfoArray);
  Memory::WriteBarrierPtr<void>::operator=(&(*ppFVar4)->fieldValue,value);
  return;
}

Assistant:

void SetFieldValue(Js::Var value)
    {
        Assert(IsMono() || (IsPoly() && !DoesntHaveEquivalence()));
        m_data.fixedFieldInfoArray[0].fieldValue = value;
    }